

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  Geometry *this;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  StackItemT<embree::NodeRefPtr<4>_> SVar13;
  StackItemT<embree::NodeRefPtr<4>_> SVar14;
  StackItemT<embree::NodeRefPtr<4>_> SVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  bool bVar21;
  byte bVar22;
  bool bVar23;
  uint uVar24;
  long lVar25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  byte bVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vfloat<4> tNear;
  undefined1 local_1048 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  pSVar26 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar40._4_4_ = fVar1;
  auVar40._0_4_ = fVar1;
  auVar40._8_4_ = fVar1;
  auVar40._12_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar41._4_4_ = fVar2;
  auVar41._0_4_ = fVar2;
  auVar41._8_4_ = fVar2;
  auVar41._12_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar42._4_4_ = fVar3;
  auVar42._0_4_ = fVar3;
  auVar42._8_4_ = fVar3;
  auVar42._12_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar32._4_4_ = uVar4;
  auVar32._0_4_ = uVar4;
  auVar32._8_4_ = uVar4;
  auVar32._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar35._4_4_ = uVar4;
  auVar35._0_4_ = uVar4;
  auVar35._8_4_ = uVar4;
  auVar35._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar33._4_4_ = uVar4;
  auVar33._0_4_ = uVar4;
  auVar33._8_4_ = uVar4;
  auVar33._12_4_ = uVar4;
  bVar23 = false;
  do {
    auVar18 = vsubps_avx(auVar40,auVar32);
    fVar9 = auVar32._0_4_;
    fVar10 = auVar32._4_4_;
    fVar11 = auVar32._8_4_;
    fVar12 = auVar32._12_4_;
    auVar32 = vsubps_avx(auVar41,auVar35);
    auVar19 = vsubps_avx(auVar42,auVar33);
    auVar36._0_4_ = fVar3 + auVar33._0_4_;
    auVar36._4_4_ = fVar3 + auVar33._4_4_;
    auVar36._8_4_ = fVar3 + auVar33._8_4_;
    auVar36._12_4_ = fVar3 + auVar33._12_4_;
    auVar43._0_4_ = fVar9 * fVar9;
    auVar43._4_4_ = fVar10 * fVar10;
    auVar43._8_4_ = fVar11 * fVar11;
    auVar43._12_4_ = fVar12 * fVar12;
LAB_00b64b63:
    do {
      do {
        if (pSVar26 == stack) {
          return bVar23;
        }
        pSVar20 = pSVar26 + -1;
        pSVar26 = pSVar26 + -1;
      } while ((float)local_1048._0_4_ < (float)pSVar20->dist);
      uVar29 = (pSVar26->ptr).ptr;
LAB_00b64b89:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar29 & 8) != 0) goto LAB_00b64e82;
        auVar33 = *(undefined1 (*) [16])(uVar29 + 0x20);
        auVar34 = *(undefined1 (*) [16])(uVar29 + 0x30);
        auVar37 = vmaxps_avx(auVar40,auVar33);
        auVar37 = vminps_avx(auVar37,auVar34);
        auVar17 = vsubps_avx(auVar37,auVar40);
        auVar37 = vmaxps_avx(auVar41,*(undefined1 (*) [16])(uVar29 + 0x40));
        auVar37 = vminps_avx(auVar37,*(undefined1 (*) [16])(uVar29 + 0x50));
        auVar16 = vsubps_avx(auVar37,auVar41);
        auVar37 = vmaxps_avx(auVar42,*(undefined1 (*) [16])(uVar29 + 0x60));
        auVar37 = vminps_avx(auVar37,*(undefined1 (*) [16])(uVar29 + 0x70));
        auVar37 = vsubps_avx(auVar37,auVar42);
        tNear.field_0.v[1] =
             auVar17._4_4_ * auVar17._4_4_ + auVar16._4_4_ * auVar16._4_4_ +
             auVar37._4_4_ * auVar37._4_4_;
        tNear.field_0.v[0] =
             auVar17._0_4_ * auVar17._0_4_ + auVar16._0_4_ * auVar16._0_4_ +
             auVar37._0_4_ * auVar37._0_4_;
        tNear.field_0.v[2] =
             auVar17._8_4_ * auVar17._8_4_ + auVar16._8_4_ * auVar16._8_4_ +
             auVar37._8_4_ * auVar37._8_4_;
        tNear.field_0.v[3] =
             auVar17._12_4_ * auVar17._12_4_ + auVar16._12_4_ * auVar16._12_4_ +
             auVar37._12_4_ * auVar37._12_4_;
        auVar37 = vcmpps_avx(auVar33,auVar34,2);
        auVar17 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0x50),auVar32,5);
        auVar37 = vandps_avx(auVar37,auVar17);
        auVar16._4_4_ = fVar1 + fVar10;
        auVar16._0_4_ = fVar1 + fVar9;
        auVar16._8_4_ = fVar1 + fVar11;
        auVar16._12_4_ = fVar1 + fVar12;
        auVar33 = vcmpps_avx(auVar33,auVar16,2);
        auVar17._4_4_ = fVar2 + auVar35._4_4_;
        auVar17._0_4_ = fVar2 + auVar35._0_4_;
        auVar17._8_4_ = fVar2 + auVar35._8_4_;
        auVar17._12_4_ = fVar2 + auVar35._12_4_;
        auVar17 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0x40),auVar17,2);
        auVar33 = vandps_avx(auVar17,auVar33);
        auVar17 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0x70),auVar19,5);
        auVar37 = vandps_avx(auVar37,auVar17);
        auVar34 = vcmpps_avx(auVar34,auVar18,5);
        auVar17 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0x60),auVar36,2);
        auVar34 = vandps_avx(auVar17,auVar34);
        auVar33 = vandps_avx(auVar33,auVar34);
        auVar33 = vandps_avx(auVar33,auVar37);
LAB_00b64c01:
        auVar33 = vpslld_avx(auVar33,0x1f);
        uVar24 = vmovmskps_avx(auVar33);
        if (uVar24 != 0) {
          uVar24 = uVar24 & 0xff;
          uVar30 = uVar29 & 0xfffffffffffffff0;
          lVar25 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          uVar29 = *(ulong *)(uVar30 + lVar25 * 8);
          uVar24 = uVar24 - 1 & uVar24;
          if (uVar24 != 0) {
            uVar6 = *(uint *)(local_1048 + lVar25 * 4 + -0x10);
            lVar25 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
              }
            }
            uVar8 = *(ulong *)(uVar30 + lVar25 * 8);
            uVar7 = *(uint *)(local_1048 + lVar25 * 4 + -0x10);
            uVar24 = uVar24 - 1 & uVar24;
            if (uVar24 == 0) {
              if (uVar6 < uVar7) {
                (pSVar26->ptr).ptr = uVar8;
                pSVar26->dist = uVar7;
                pSVar26 = pSVar26 + 1;
              }
              else {
                (pSVar26->ptr).ptr = uVar29;
                pSVar26->dist = uVar6;
                pSVar26 = pSVar26 + 1;
                uVar29 = uVar8;
              }
            }
            else {
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar29;
              auVar33 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar6));
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar8;
              auVar34 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar7));
              lVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)(uVar30 + lVar25 * 8);
              auVar17 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_1048 + lVar25 * 4 + -0x10)))
              ;
              auVar37 = vpcmpgtd_avx(auVar34,auVar33);
              uVar24 = uVar24 - 1 & uVar24;
              if (uVar24 == 0) {
                auVar16 = vpshufd_avx(auVar37,0xaa);
                auVar37 = vblendvps_avx(auVar34,auVar33,auVar16);
                auVar33 = vblendvps_avx(auVar33,auVar34,auVar16);
                auVar34 = vpcmpgtd_avx(auVar17,auVar37);
                auVar16 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar17,auVar37,auVar16);
                auVar37 = vblendvps_avx(auVar37,auVar17,auVar16);
                auVar17 = vpcmpgtd_avx(auVar37,auVar33);
                auVar17 = vpshufd_avx(auVar17,0xaa);
                SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar37,auVar33,auVar17);
                SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar37,auVar17);
                *pSVar26 = SVar14;
                pSVar26[1] = SVar13;
                uVar29 = auVar34._0_8_;
                pSVar26 = pSVar26 + 2;
              }
              else {
                lVar25 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                auVar39._8_8_ = 0;
                auVar39._0_8_ = *(ulong *)(uVar30 + lVar25 * 8);
                auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_1048 + lVar25 * 4 + -0x10)
                                                         ));
                auVar16 = vpshufd_avx(auVar37,0xaa);
                auVar37 = vblendvps_avx(auVar34,auVar33,auVar16);
                auVar33 = vblendvps_avx(auVar33,auVar34,auVar16);
                auVar34 = vpcmpgtd_avx(auVar38,auVar17);
                auVar16 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar38,auVar17,auVar16);
                auVar17 = vblendvps_avx(auVar17,auVar38,auVar16);
                auVar16 = vpcmpgtd_avx(auVar17,auVar33);
                auVar38 = vpshufd_avx(auVar16,0xaa);
                auVar16 = vblendvps_avx(auVar17,auVar33,auVar38);
                SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar17,auVar38);
                auVar33 = vpcmpgtd_avx(auVar34,auVar37);
                auVar17 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar34,auVar37,auVar17);
                auVar34 = vblendvps_avx(auVar37,auVar34,auVar17);
                auVar37 = vpcmpgtd_avx(auVar16,auVar34);
                auVar37 = vpshufd_avx(auVar37,0xaa);
                SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar16,auVar34,auVar37);
                SVar15 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar34,auVar16,auVar37);
                *pSVar26 = SVar13;
                pSVar26[1] = SVar15;
                pSVar26[2] = SVar14;
                uVar29 = auVar33._0_8_;
                pSVar26 = pSVar26 + 3;
              }
            }
          }
          goto LAB_00b64b89;
        }
        goto LAB_00b64b63;
      }
      if ((uVar29 & 8) == 0) {
        auVar33 = vmaxps_avx(auVar40,*(undefined1 (*) [16])(uVar29 + 0x20));
        auVar34 = vminps_avx(auVar33,*(undefined1 (*) [16])(uVar29 + 0x30));
        auVar33 = vmaxps_avx(auVar41,*(undefined1 (*) [16])(uVar29 + 0x40));
        auVar33 = vminps_avx(auVar33,*(undefined1 (*) [16])(uVar29 + 0x50));
        auVar34 = vsubps_avx(auVar34,auVar40);
        auVar37 = vsubps_avx(auVar33,auVar41);
        auVar33 = vmaxps_avx(auVar42,*(undefined1 (*) [16])(uVar29 + 0x60));
        auVar33 = vminps_avx(auVar33,*(undefined1 (*) [16])(uVar29 + 0x70));
        auVar33 = vsubps_avx(auVar33,auVar42);
        tNear.field_0.v[0] =
             auVar34._0_4_ * auVar34._0_4_ + auVar37._0_4_ * auVar37._0_4_ +
             auVar33._0_4_ * auVar33._0_4_;
        tNear.field_0.v[1] =
             auVar34._4_4_ * auVar34._4_4_ + auVar37._4_4_ * auVar37._4_4_ +
             auVar33._4_4_ * auVar33._4_4_;
        tNear.field_0.v[2] =
             auVar34._8_4_ * auVar34._8_4_ + auVar37._8_4_ * auVar37._8_4_ +
             auVar33._8_4_ * auVar33._8_4_;
        tNear.field_0.v[3] =
             auVar34._12_4_ * auVar34._12_4_ + auVar37._12_4_ * auVar37._12_4_ +
             auVar33._12_4_ * auVar33._12_4_;
        auVar33 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar43,2);
        auVar34 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0x20),
                             *(undefined1 (*) [16])(uVar29 + 0x30),2);
        auVar33 = vandps_avx(auVar33,auVar34);
        goto LAB_00b64c01;
      }
LAB_00b64e82:
      lVar31 = (uVar29 & 0xfffffffffffffff0) + 0xa0;
      bVar22 = 0;
      for (lVar25 = 0; lVar25 != (ulong)((uint)uVar29 & 0xf) - 8; lVar25 = lVar25 + 1) {
        bVar27 = 0;
        for (lVar28 = -0x10; lVar28 != 0; lVar28 = lVar28 + 4) {
          uVar24 = *(uint *)(lVar31 + lVar28);
          if ((ulong)uVar24 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar24].ptr;
          context->geomID = uVar24;
          context->primID = *(uint *)(lVar31 + 0x10 + lVar28);
          bVar21 = Geometry::pointQuery(this,query,context);
          bVar27 = bVar27 | bVar21;
        }
        bVar22 = bVar22 | bVar27;
        lVar31 = lVar31 + 0xb0;
      }
    } while (bVar22 == 0);
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar32._4_4_ = uVar4;
    auVar32._0_4_ = uVar4;
    auVar32._8_4_ = uVar4;
    auVar32._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar35._4_4_ = uVar4;
    auVar35._0_4_ = uVar4;
    auVar35._8_4_ = uVar4;
    auVar35._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar33._4_4_ = uVar4;
    auVar33._0_4_ = uVar4;
    auVar33._8_4_ = uVar4;
    auVar33._12_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    }
    bVar23 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }